

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keyboard.cpp
# Opt level: O1

bool __thiscall
Inputs::Keyboard::set_key_pressed(Keyboard *this,Key key,char param_2,bool is_pressed,bool param_4)

{
  _Bit_type *p_Var1;
  Delegate *pDVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(int)key;
  if ((ulong)(this->key_states_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->key_states_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(this->key_states_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <= uVar6) {
    std::vector<bool,_std::allocator<bool>_>::resize(&this->key_states_,uVar6 + 1,false);
  }
  uVar5 = uVar6 + 0x3f;
  if (-1 < (long)uVar6) {
    uVar5 = uVar6;
  }
  lVar4 = (long)uVar5 >> 6;
  p_Var1 = (this->key_states_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar6 = (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001);
  uVar5 = 1L << ((byte)key & 0x3f);
  if (is_pressed) {
    uVar5 = uVar5 | p_Var1[lVar4 + uVar6 + 0xffffffffffffffff];
  }
  else {
    uVar5 = ~uVar5 & p_Var1[lVar4 + uVar6 + 0xffffffffffffffff];
  }
  p_Var1[lVar4 + uVar6 + 0xffffffffffffffff] = uVar5;
  pDVar2 = this->delegate_;
  if (pDVar2 != (Delegate *)0x0) {
    iVar3 = (**pDVar2->_vptr_Delegate)(pDVar2,this,key,(ulong)is_pressed);
    return SUB41(iVar3,0);
  }
  return false;
}

Assistant:

bool Keyboard::set_key_pressed(Key key, char, bool is_pressed, bool) {
	const size_t key_offset = size_t(key);
	if(key_offset >= key_states_.size()) {
		key_states_.resize(key_offset+1, false);
	}
	key_states_[key_offset] = is_pressed;

	if(delegate_) return delegate_->keyboard_did_change_key(this, key, is_pressed);
	return false;
}